

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void init_rsc(YV12_BUFFER_CONFIG *src,AV1_COMMON *cm,MACROBLOCK *x,
             LOOP_FILTER_SPEED_FEATURES *lpf_sf,int plane,RestUnitSearchInfo *rusi,
             YV12_BUFFER_CONFIG *dst,RestSearchCtxt *rsc)

{
  uint8_t *in_RCX;
  anon_union_8_2_abde48f3_for_yv12_buffer_config_6 in_RDX;
  anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 in_RSI;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 in_RDI;
  int in_R8D;
  uint8_t *in_R9;
  int plane_h;
  int plane_w;
  int is_uv;
  YV12_BUFFER_CONFIG *dgd;
  int local_44;
  int local_40;
  uint local_3c;
  YV12_BUFFER_CONFIG *local_38;
  int local_24;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 local_8;
  
  dgd->field_0 = in_RDI;
  dgd->field_1 = _plane_w;
  dgd->field_2 = in_RSI;
  dgd->field_3 = in_RDX;
  (dgd->field_4).field_0.y_stride = in_R8D;
  (dgd->field_5).field_0.u_buffer = in_R9;
  (dgd->field_5).field_0.v_buffer = in_RCX;
  local_38 = &(*(RefCntBuffer **)((long)in_RSI + 0xe8))->buf;
  local_3c = (uint)(in_R8D != 0);
  local_24 = in_R8D;
  local_8 = in_RDI;
  av1_get_upsampled_plane_size((AV1_COMMON *)in_RSI,local_3c,&local_40,&local_44);
  (dgd->field_4).field_0.uv_stride = local_40;
  *(int *)&dgd->field_5 = local_44;
  dgd->store_buf_adr[1] = *(uint8_t **)((long)local_8 + 0x28 + (long)local_24 * 8);
  *(undefined4 *)(dgd->store_buf_adr + 2) =
       *(undefined4 *)((long)local_8 + 0x20 + (long)(int)local_3c * 4);
  *(uint8_t **)&dgd->use_external_reference_buffers = local_38->store_buf_adr[(long)local_24 + -4];
  *(undefined4 *)dgd->store_buf_adr =
       *(undefined4 *)((long)local_38->store_buf_adr + (long)(int)local_3c * 4 + -0x28);
  return;
}

Assistant:

static inline void init_rsc(const YV12_BUFFER_CONFIG *src, const AV1_COMMON *cm,
                            const MACROBLOCK *x,
                            const LOOP_FILTER_SPEED_FEATURES *lpf_sf, int plane,
                            RestUnitSearchInfo *rusi, YV12_BUFFER_CONFIG *dst,
                            RestSearchCtxt *rsc) {
  rsc->src = src;
  rsc->dst = dst;
  rsc->cm = cm;
  rsc->x = x;
  rsc->plane = plane;
  rsc->rusi = rusi;
  rsc->lpf_sf = lpf_sf;

  const YV12_BUFFER_CONFIG *dgd = &cm->cur_frame->buf;
  const int is_uv = plane != AOM_PLANE_Y;
  int plane_w, plane_h;
  av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);
  assert(plane_w == src->crop_widths[is_uv]);
  assert(plane_h == src->crop_heights[is_uv]);
  assert(src->crop_widths[is_uv] == dgd->crop_widths[is_uv]);
  assert(src->crop_heights[is_uv] == dgd->crop_heights[is_uv]);

  rsc->plane_w = plane_w;
  rsc->plane_h = plane_h;
  rsc->src_buffer = src->buffers[plane];
  rsc->src_stride = src->strides[is_uv];
  rsc->dgd_buffer = dgd->buffers[plane];
  rsc->dgd_stride = dgd->strides[is_uv];
}